

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureTarget.cpp
# Opt level: O3

void __thiscall
Outputs::Display::OpenGL::TextureTarget::draw
          (TextureTarget *this,float aspect_ratio,float colour_threshold)

{
  unique_ptr<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  Shader *pSVar4;
  int iVar5;
  GLint GVar6;
  GLint GVar7;
  ostream *poVar8;
  socklen_t in_ECX;
  sockaddr *in_RDX;
  sockaddr *__addr;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  long lVar9;
  int in_ESI;
  pointer __p;
  ulong uVar10;
  char *pcVar11;
  undefined4 in_XMM0_Db;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  char *fragment_shader;
  char *vertex_shader;
  string local_a8;
  uint uStack_88;
  undefined4 local_84;
  float local_80;
  undefined4 local_7c;
  uint local_78;
  undefined4 local_74;
  float local_70;
  undefined4 local_6c;
  float local_5c;
  float local_58;
  undefined4 uStack_54;
  char *local_40;
  char *local_38;
  
  local_5c = colour_threshold;
  if ((this->pixel_shader_)._M_t.
      super___uniq_ptr_impl<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
      ._M_t.
      super__Tuple_impl<0UL,_Outputs::Display::OpenGL::Shader_*,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
      .super__Head_base<0UL,_Outputs::Display::OpenGL::Shader_*,_false>._M_head_impl !=
      (Shader *)0x0) {
LAB_003cd7fb:
    if ((this->set_aspect_ratio_ != aspect_ratio) ||
       (NAN(this->set_aspect_ratio_) || NAN(aspect_ratio))) {
      this->set_aspect_ratio_ = aspect_ratio;
      local_a8._M_string_length._4_4_ = 0;
      uVar2 = this->width_;
      uVar3 = this->height_;
      fVar14 = (float)(int)uVar3;
      auVar12._4_4_ = (float)(int)uVar2 / fVar14;
      auVar12._0_4_ = fVar14;
      auVar12._8_4_ = fVar14;
      auVar12._12_4_ = fVar14;
      local_80 = (float)(int)uVar2 / (float)this->expanded_width_;
      local_7c = 0;
      local_a8._M_dataplus._M_p._4_4_ = 0xbf800000;
      local_a8._M_string_length._0_4_ = 0;
      auVar13._4_4_ = aspect_ratio;
      auVar13._0_4_ = (float)this->expanded_height_;
      auVar13._8_4_ = 0;
      auVar13._12_4_ = in_XMM0_Db;
      auVar13 = divps(auVar12,auVar13);
      local_a8.field_2._12_4_ = auVar13._0_4_;
      uStack_88 = auVar13._4_4_;
      local_a8.field_2._M_allocated_capacity._4_4_ = 0x3f800000;
      local_a8.field_2._8_4_ = 0;
      local_a8._M_dataplus._M_p._0_4_ = uStack_88 ^ 0x80000000;
      local_84 = 0xbf800000;
      local_74 = 0x3f800000;
      local_a8.field_2._M_allocated_capacity._0_4_ = (uint)local_a8._M_dataplus._M_p;
      local_78 = uStack_88;
      local_70 = local_80;
      local_6c = local_a8.field_2._12_4_;
      glBindBuffer(0x8892,this->drawing_array_buffer_);
      iVar5 = glGetError();
      if (iVar5 == 0) {
        in_ESI = 0x40;
        in_ECX = 0x88e4;
        glBufferData(0x8892,0x40,&local_a8);
        iVar5 = glGetError();
        in_RDX = extraout_RDX_01;
        if (iVar5 == 0) goto LAB_003cd8f1;
        switch(iVar5) {
        case 0x500:
          pcVar11 = "GL_INVALID_ENUM";
          lVar9 = 0xf;
          break;
        case 0x501:
          pcVar11 = "GL_INVALID_VALUE";
          goto LAB_003ce028;
        case 0x502:
          pcVar11 = "GL_INVALID_OPERATION";
          lVar9 = 0x14;
          break;
        default:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6);
          std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          goto LAB_003ce032;
        case 0x505:
          pcVar11 = "GL_OUT_OF_MEMORY";
LAB_003ce028:
          lVar9 = 0x10;
          break;
        case 0x506:
          pcVar11 = "GL_INVALID_FRAMEBUFFER_OPERATION";
          lVar9 = 0x20;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar11,lVar9);
LAB_003ce032:
        poVar8 = std::operator<<((ostream *)&std::cerr," at line ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xaf);
        poVar8 = std::operator<<(poVar8," in ");
        poVar8 = std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                                );
        std::endl<char,std::char_traits<char>>(poVar8);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                      ,0xaf,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const"
                     );
      }
      switch(iVar5) {
      case 0x500:
        pcVar11 = "GL_INVALID_ENUM";
        lVar9 = 0xf;
        break;
      case 0x501:
        pcVar11 = "GL_INVALID_VALUE";
        goto LAB_003cdf72;
      case 0x502:
        pcVar11 = "GL_INVALID_OPERATION";
        lVar9 = 0x14;
        break;
      default:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6);
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        goto LAB_003cdf7c;
      case 0x505:
        pcVar11 = "GL_OUT_OF_MEMORY";
LAB_003cdf72:
        lVar9 = 0x10;
        break;
      case 0x506:
        pcVar11 = "GL_INVALID_FRAMEBUFFER_OPERATION";
        lVar9 = 0x20;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar11,lVar9);
LAB_003cdf7c:
      poVar8 = std::operator<<((ostream *)&std::cerr," at line ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xae);
      poVar8 = std::operator<<(poVar8," in ");
      poVar8 = std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                              );
      std::endl<char,std::char_traits<char>>(poVar8);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                    ,0xae,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
    }
LAB_003cd8f1:
    Shader::bind((this->pixel_shader_)._M_t.
                 super___uniq_ptr_impl<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Outputs::Display::OpenGL::Shader_*,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
                 .super__Head_base<0UL,_Outputs::Display::OpenGL::Shader_*,_false>._M_head_impl,
                 in_ESI,in_RDX,in_ECX);
    glUniform1f(this->threshold_uniform_);
    iVar5 = glGetError();
    if (iVar5 == 0) {
      glBindVertexArray(this->drawing_vertex_array_);
      iVar5 = glGetError();
      if (iVar5 != 0) {
        switch(iVar5) {
        case 0x500:
          pcVar11 = "GL_INVALID_ENUM";
          lVar9 = 0xf;
          break;
        case 0x501:
          pcVar11 = "GL_INVALID_VALUE";
          goto LAB_003cdd87;
        case 0x502:
          pcVar11 = "GL_INVALID_OPERATION";
          lVar9 = 0x14;
          break;
        default:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6);
          std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          goto LAB_003cdd91;
        case 0x505:
          pcVar11 = "GL_OUT_OF_MEMORY";
LAB_003cdd87:
          lVar9 = 0x10;
          break;
        case 0x506:
          pcVar11 = "GL_INVALID_FRAMEBUFFER_OPERATION";
          lVar9 = 0x20;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar11,lVar9);
LAB_003cdd91:
        poVar8 = std::operator<<((ostream *)&std::cerr," at line ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xb5);
        poVar8 = std::operator<<(poVar8," in ");
        poVar8 = std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                                );
        std::endl<char,std::char_traits<char>>(poVar8);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                      ,0xb5,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const"
                     );
      }
      glDrawArrays(5,0,4);
      iVar5 = glGetError();
      if (iVar5 == 0) {
        return;
      }
      switch(iVar5) {
      case 0x500:
        pcVar11 = "GL_INVALID_ENUM";
        lVar9 = 0xf;
        break;
      case 0x501:
        pcVar11 = "GL_INVALID_VALUE";
        goto LAB_003cde3d;
      case 0x502:
        pcVar11 = "GL_INVALID_OPERATION";
        lVar9 = 0x14;
        break;
      default:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6);
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        goto LAB_003cde47;
      case 0x505:
        pcVar11 = "GL_OUT_OF_MEMORY";
LAB_003cde3d:
        lVar9 = 0x10;
        break;
      case 0x506:
        pcVar11 = "GL_INVALID_FRAMEBUFFER_OPERATION";
        lVar9 = 0x20;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar11,lVar9);
LAB_003cde47:
      poVar8 = std::operator<<((ostream *)&std::cerr," at line ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xb6);
      poVar8 = std::operator<<(poVar8," in ");
      poVar8 = std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                              );
      std::endl<char,std::char_traits<char>>(poVar8);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                    ,0xb6,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
    }
    switch(iVar5) {
    case 0x500:
      pcVar11 = "GL_INVALID_ENUM";
      lVar9 = 0xf;
      break;
    case 0x501:
      pcVar11 = "GL_INVALID_VALUE";
      goto LAB_003cdcd1;
    case 0x502:
      pcVar11 = "GL_INVALID_OPERATION";
      lVar9 = 0x14;
      break;
    default:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6);
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      goto LAB_003cdcdb;
    case 0x505:
      pcVar11 = "GL_OUT_OF_MEMORY";
LAB_003cdcd1:
      lVar9 = 0x10;
      break;
    case 0x506:
      pcVar11 = "GL_INVALID_FRAMEBUFFER_OPERATION";
      lVar9 = 0x20;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar11,lVar9);
LAB_003cdcdb:
    poVar8 = std::operator<<((ostream *)&std::cerr," at line ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xb3);
    poVar8 = std::operator<<(poVar8," in ");
    poVar8 = std::operator<<(poVar8,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                            );
    std::endl<char,std::char_traits<char>>(poVar8);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                  ,0xb3,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
  }
  this_00 = &this->pixel_shader_;
  local_38 = 
  "#version 150\nin vec2 texCoord;in vec2 position;out vec2 texCoordVarying;void main(void){texCoordVarying = texCoord;gl_Position = vec4(position, 0.0, 1.0);}"
  ;
  local_40 = 
  "#version 150\nin vec2 texCoordVarying;uniform sampler2D texID;uniform float threshold;out vec4 fragColour;void main(void){fragColour = clamp(texture(texID, texCoordVarying), threshold, 1.0);}"
  ;
  local_58 = aspect_ratio;
  uStack_54 = in_XMM0_Db;
  std::make_unique<Outputs::Display::OpenGL::Shader,char_const*&,char_const*&>
            ((char **)&local_a8,&local_38);
  __p = (pointer)CONCAT44(local_a8._M_dataplus._M_p._4_4_,(uint)local_a8._M_dataplus._M_p);
  local_a8._M_dataplus._M_p._0_4_ = 0;
  local_a8._M_dataplus._M_p._4_4_ = 0;
  std::
  __uniq_ptr_impl<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
  ::reset((__uniq_ptr_impl<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
           *)this_00,__p);
  iVar5 = (int)__p;
  std::
  unique_ptr<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
  ::~unique_ptr((unique_ptr<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
                 *)&local_a8);
  Shader::bind((this->pixel_shader_)._M_t.
               super___uniq_ptr_impl<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
               ._M_t.
               super__Tuple_impl<0UL,_Outputs::Display::OpenGL::Shader_*,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
               .super__Head_base<0UL,_Outputs::Display::OpenGL::Shader_*,_false>._M_head_impl,iVar5,
               __addr,in_ECX);
  glGenVertexArrays(1,&this->drawing_vertex_array_);
  iVar5 = glGetError();
  if (iVar5 == 0) {
    glGenBuffers(1,&this->drawing_array_buffer_);
    iVar5 = glGetError();
    if (iVar5 == 0) {
      glBindVertexArray(this->drawing_vertex_array_);
      iVar5 = glGetError();
      if (iVar5 == 0) {
        glBindBuffer(0x8892,this->drawing_array_buffer_);
        iVar5 = glGetError();
        if (iVar5 == 0) {
          pSVar4 = (this_00->_M_t).
                   super___uniq_ptr_impl<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Outputs::Display::OpenGL::Shader_*,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
                   .super__Head_base<0UL,_Outputs::Display::OpenGL::Shader_*,_false>._M_head_impl;
          paVar1 = &local_a8.field_2;
          local_a8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"position","");
          GVar6 = Shader::get_attrib_location(pSVar4,&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != paVar1) {
            operator_delete(local_a8._M_dataplus._M_p,
                            CONCAT44(local_a8.field_2._M_allocated_capacity._4_4_,
                                     local_a8.field_2._M_allocated_capacity._0_4_) + 1);
          }
          pSVar4 = (this_00->_M_t).
                   super___uniq_ptr_impl<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Outputs::Display::OpenGL::Shader_*,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
                   .super__Head_base<0UL,_Outputs::Display::OpenGL::Shader_*,_false>._M_head_impl;
          local_a8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"texCoord","");
          GVar7 = Shader::get_attrib_location(pSVar4,&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != paVar1) {
            operator_delete(local_a8._M_dataplus._M_p,
                            CONCAT44(local_a8.field_2._M_allocated_capacity._4_4_,
                                     local_a8.field_2._M_allocated_capacity._0_4_) + 1);
          }
          glEnableVertexAttribArray(GVar6);
          iVar5 = glGetError();
          if (iVar5 == 0) {
            glEnableVertexAttribArray(GVar7);
            iVar5 = glGetError();
            if (iVar5 == 0) {
              glVertexAttribPointer(GVar6,2,0x1406,0,0x10,0);
              iVar5 = glGetError();
              if (iVar5 == 0) {
                in_ECX = 0;
                glVertexAttribPointer(GVar7,2,0x1406,0,0x10,8);
                iVar5 = glGetError();
                if (iVar5 == 0) {
                  pSVar4 = (this_00->_M_t).
                           super___uniq_ptr_impl<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Outputs::Display::OpenGL::Shader_*,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
                           .super__Head_base<0UL,_Outputs::Display::OpenGL::Shader_*,_false>.
                           _M_head_impl;
                  local_a8._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"texID","");
                  GVar6 = Shader::get_uniform_location(pSVar4,&local_a8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p != paVar1) {
                    operator_delete(local_a8._M_dataplus._M_p,
                                    CONCAT44(local_a8.field_2._M_allocated_capacity._4_4_,
                                             local_a8.field_2._M_allocated_capacity._0_4_) + 1);
                  }
                  glUniform1i(GVar6,this->texture_unit_ - 0x84c0);
                  iVar5 = glGetError();
                  if (iVar5 == 0) {
                    pSVar4 = (this_00->_M_t).
                             super___uniq_ptr_impl<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Outputs::Display::OpenGL::Shader_*,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
                             .super__Head_base<0UL,_Outputs::Display::OpenGL::Shader_*,_false>.
                             _M_head_impl;
                    local_a8._M_dataplus._M_p = (pointer)paVar1;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_a8,"threshold","");
                    in_ESI = (int)&local_a8;
                    GVar6 = Shader::get_uniform_location(pSVar4,&local_a8);
                    this->threshold_uniform_ = GVar6;
                    in_RDX = extraout_RDX;
                    aspect_ratio = local_58;
                    in_XMM0_Db = uStack_54;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_a8._M_dataplus._M_p != paVar1) {
                      uVar10 = CONCAT44(local_a8.field_2._M_allocated_capacity._4_4_,
                                        local_a8.field_2._M_allocated_capacity._0_4_) + 1;
                      operator_delete(local_a8._M_dataplus._M_p,uVar10);
                      in_ESI = (int)uVar10;
                      in_RDX = extraout_RDX_00;
                      aspect_ratio = local_58;
                      in_XMM0_Db = uStack_54;
                    }
                    goto LAB_003cd7fb;
                  }
                  switch(iVar5) {
                  case 0x500:
                    pcVar11 = "GL_INVALID_ENUM";
                    lVar9 = 0xf;
                    break;
                  case 0x501:
                    pcVar11 = "GL_INVALID_VALUE";
                    goto LAB_003ce6e4;
                  case 0x502:
                    pcVar11 = "GL_INVALID_OPERATION";
                    lVar9 = 0x14;
                    break;
                  default:
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"Error ",6);
                    std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
                    goto LAB_003ce6ee;
                  case 0x505:
                    pcVar11 = "GL_OUT_OF_MEMORY";
LAB_003ce6e4:
                    lVar9 = 0x10;
                    break;
                  case 0x506:
                    pcVar11 = "GL_INVALID_FRAMEBUFFER_OPERATION";
                    lVar9 = 0x20;
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,pcVar11,lVar9);
LAB_003ce6ee:
                  poVar8 = std::operator<<((ostream *)&std::cerr," at line ");
                  poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x91);
                  poVar8 = std::operator<<(poVar8," in ");
                  poVar8 = std::operator<<(poVar8,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                                          );
                  std::endl<char,std::char_traits<char>>(poVar8);
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                                ,0x91,
                                "void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const"
                               );
                }
                switch(iVar5) {
                case 0x500:
                  pcVar11 = "GL_INVALID_ENUM";
                  lVar9 = 0xf;
                  break;
                case 0x501:
                  pcVar11 = "GL_INVALID_VALUE";
                  goto LAB_003ce62e;
                case 0x502:
                  pcVar11 = "GL_INVALID_OPERATION";
                  lVar9 = 0x14;
                  break;
                default:
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"Error ",6);
                  std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
                  goto LAB_003ce638;
                case 0x505:
                  pcVar11 = "GL_OUT_OF_MEMORY";
LAB_003ce62e:
                  lVar9 = 0x10;
                  break;
                case 0x506:
                  pcVar11 = "GL_INVALID_FRAMEBUFFER_OPERATION";
                  lVar9 = 0x20;
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,pcVar11,lVar9);
LAB_003ce638:
                poVar8 = std::operator<<((ostream *)&std::cerr," at line ");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x8e);
                poVar8 = std::operator<<(poVar8," in ");
                poVar8 = std::operator<<(poVar8,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                                        );
                std::endl<char,std::char_traits<char>>(poVar8);
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                              ,0x8e,
                              "void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const"
                             );
              }
              switch(iVar5) {
              case 0x500:
                pcVar11 = "GL_INVALID_ENUM";
                lVar9 = 0xf;
                break;
              case 0x501:
                pcVar11 = "GL_INVALID_VALUE";
                goto LAB_003ce578;
              case 0x502:
                pcVar11 = "GL_INVALID_OPERATION";
                lVar9 = 0x14;
                break;
              default:
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6)
                ;
                std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
                goto LAB_003ce582;
              case 0x505:
                pcVar11 = "GL_OUT_OF_MEMORY";
LAB_003ce578:
                lVar9 = 0x10;
                break;
              case 0x506:
                pcVar11 = "GL_INVALID_FRAMEBUFFER_OPERATION";
                lVar9 = 0x20;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,pcVar11,lVar9);
LAB_003ce582:
              poVar8 = std::operator<<((ostream *)&std::cerr," at line ");
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x8d);
              poVar8 = std::operator<<(poVar8," in ");
              poVar8 = std::operator<<(poVar8,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                                      );
              std::endl<char,std::char_traits<char>>(poVar8);
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                            ,0x8d,
                            "void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const"
                           );
            }
            switch(iVar5) {
            case 0x500:
              pcVar11 = "GL_INVALID_ENUM";
              lVar9 = 0xf;
              break;
            case 0x501:
              pcVar11 = "GL_INVALID_VALUE";
              goto LAB_003ce4c2;
            case 0x502:
              pcVar11 = "GL_INVALID_OPERATION";
              lVar9 = 0x14;
              break;
            default:
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6);
              std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
              goto LAB_003ce4cc;
            case 0x505:
              pcVar11 = "GL_OUT_OF_MEMORY";
LAB_003ce4c2:
              lVar9 = 0x10;
              break;
            case 0x506:
              pcVar11 = "GL_INVALID_FRAMEBUFFER_OPERATION";
              lVar9 = 0x20;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar11,lVar9);
LAB_003ce4cc:
            poVar8 = std::operator<<((ostream *)&std::cerr," at line ");
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x8a);
            poVar8 = std::operator<<(poVar8," in ");
            poVar8 = std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                                    );
            std::endl<char,std::char_traits<char>>(poVar8);
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                          ,0x8a,
                          "void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
          }
          switch(iVar5) {
          case 0x500:
            pcVar11 = "GL_INVALID_ENUM";
            lVar9 = 0xf;
            break;
          case 0x501:
            pcVar11 = "GL_INVALID_VALUE";
            goto LAB_003ce40c;
          case 0x502:
            pcVar11 = "GL_INVALID_OPERATION";
            lVar9 = 0x14;
            break;
          default:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6);
            std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            goto LAB_003ce416;
          case 0x505:
            pcVar11 = "GL_OUT_OF_MEMORY";
LAB_003ce40c:
            lVar9 = 0x10;
            break;
          case 0x506:
            pcVar11 = "GL_INVALID_FRAMEBUFFER_OPERATION";
            lVar9 = 0x20;
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar11,lVar9);
LAB_003ce416:
          poVar8 = std::operator<<((ostream *)&std::cerr," at line ");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x89);
          poVar8 = std::operator<<(poVar8," in ");
          poVar8 = std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                                  );
          std::endl<char,std::char_traits<char>>(poVar8);
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                        ,0x89,
                        "void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
        }
        switch(iVar5) {
        case 0x500:
          pcVar11 = "GL_INVALID_ENUM";
          lVar9 = 0xf;
          break;
        case 0x501:
          pcVar11 = "GL_INVALID_VALUE";
          goto LAB_003ce356;
        case 0x502:
          pcVar11 = "GL_INVALID_OPERATION";
          lVar9 = 0x14;
          break;
        default:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6);
          std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          goto LAB_003ce360;
        case 0x505:
          pcVar11 = "GL_OUT_OF_MEMORY";
LAB_003ce356:
          lVar9 = 0x10;
          break;
        case 0x506:
          pcVar11 = "GL_INVALID_FRAMEBUFFER_OPERATION";
          lVar9 = 0x20;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar11,lVar9);
LAB_003ce360:
        poVar8 = std::operator<<((ostream *)&std::cerr," at line ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x84);
        poVar8 = std::operator<<(poVar8," in ");
        poVar8 = std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                                );
        std::endl<char,std::char_traits<char>>(poVar8);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                      ,0x84,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const"
                     );
      }
      switch(iVar5) {
      case 0x500:
        pcVar11 = "GL_INVALID_ENUM";
        lVar9 = 0xf;
        break;
      case 0x501:
        pcVar11 = "GL_INVALID_VALUE";
        goto LAB_003ce2a0;
      case 0x502:
        pcVar11 = "GL_INVALID_OPERATION";
        lVar9 = 0x14;
        break;
      default:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6);
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        goto LAB_003ce2aa;
      case 0x505:
        pcVar11 = "GL_OUT_OF_MEMORY";
LAB_003ce2a0:
        lVar9 = 0x10;
        break;
      case 0x506:
        pcVar11 = "GL_INVALID_FRAMEBUFFER_OPERATION";
        lVar9 = 0x20;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar11,lVar9);
LAB_003ce2aa:
      poVar8 = std::operator<<((ostream *)&std::cerr," at line ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x83);
      poVar8 = std::operator<<(poVar8," in ");
      poVar8 = std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                              );
      std::endl<char,std::char_traits<char>>(poVar8);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                    ,0x83,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
    }
    switch(iVar5) {
    case 0x500:
      pcVar11 = "GL_INVALID_ENUM";
      lVar9 = 0xf;
      break;
    case 0x501:
      pcVar11 = "GL_INVALID_VALUE";
      goto LAB_003ce1ea;
    case 0x502:
      pcVar11 = "GL_INVALID_OPERATION";
      lVar9 = 0x14;
      break;
    default:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6);
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      goto LAB_003ce1f4;
    case 0x505:
      pcVar11 = "GL_OUT_OF_MEMORY";
LAB_003ce1ea:
      lVar9 = 0x10;
      break;
    case 0x506:
      pcVar11 = "GL_INVALID_FRAMEBUFFER_OPERATION";
      lVar9 = 0x20;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar11,lVar9);
LAB_003ce1f4:
    poVar8 = std::operator<<((ostream *)&std::cerr," at line ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x81);
    poVar8 = std::operator<<(poVar8," in ");
    poVar8 = std::operator<<(poVar8,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                            );
    std::endl<char,std::char_traits<char>>(poVar8);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                  ,0x81,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
  }
  switch(iVar5) {
  case 0x500:
    pcVar11 = "GL_INVALID_ENUM";
    lVar9 = 0xf;
    break;
  case 0x501:
    pcVar11 = "GL_INVALID_VALUE";
    goto LAB_003ce134;
  case 0x502:
    pcVar11 = "GL_INVALID_OPERATION";
    lVar9 = 0x14;
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6);
    std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    goto LAB_003ce13e;
  case 0x505:
    pcVar11 = "GL_OUT_OF_MEMORY";
LAB_003ce134:
    lVar9 = 0x10;
    break;
  case 0x506:
    pcVar11 = "GL_INVALID_FRAMEBUFFER_OPERATION";
    lVar9 = 0x20;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar11,lVar9);
LAB_003ce13e:
  poVar8 = std::operator<<((ostream *)&std::cerr," at line ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x80);
  poVar8 = std::operator<<(poVar8," in ");
  poVar8 = std::operator<<(poVar8,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                          );
  std::endl<char,std::char_traits<char>>(poVar8);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                ,0x80,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
}

Assistant:

void TextureTarget::draw(float aspect_ratio, float colour_threshold) const {
	if(!pixel_shader_) {
		const char *vertex_shader =
			"#version 150\n"

			"in vec2 texCoord;"
			"in vec2 position;"

			"out vec2 texCoordVarying;"

			"void main(void)"
			"{"
				"texCoordVarying = texCoord;"
				"gl_Position = vec4(position, 0.0, 1.0);"
			"}";
		const char *fragment_shader =
			"#version 150\n"

			"in vec2 texCoordVarying;"

			"uniform sampler2D texID;"
			"uniform float threshold;"

			"out vec4 fragColour;"

			"void main(void)"
			"{"
				"fragColour = clamp(texture(texID, texCoordVarying), threshold, 1.0);"
			"}";
		pixel_shader_ = std::make_unique<Shader>(vertex_shader, fragment_shader);
		pixel_shader_->bind();

		test_gl(glGenVertexArrays, 1, &drawing_vertex_array_);
		test_gl(glGenBuffers, 1, &drawing_array_buffer_);

		test_gl(glBindVertexArray, drawing_vertex_array_);
		test_gl(glBindBuffer, GL_ARRAY_BUFFER, drawing_array_buffer_);

		const GLint position_attribute	= pixel_shader_->get_attrib_location("position");
		const GLint tex_coord_attribute	= pixel_shader_->get_attrib_location("texCoord");

		test_gl(glEnableVertexAttribArray, GLuint(position_attribute));
		test_gl(glEnableVertexAttribArray, GLuint(tex_coord_attribute));

		const GLsizei vertex_stride = 4 * sizeof(GLfloat);
		test_gl(glVertexAttribPointer, GLuint(position_attribute),	2, GL_FLOAT,	GL_FALSE,	vertex_stride,	(void *)0);
		test_gl(glVertexAttribPointer, GLuint(tex_coord_attribute),	2, GL_FLOAT,	GL_FALSE,	vertex_stride,	(void *)(2 * sizeof(GLfloat)));

		const GLint texIDUniform = pixel_shader_->get_uniform_location("texID");
		test_gl(glUniform1i, texIDUniform, GLint(texture_unit_ - GL_TEXTURE0));

		threshold_uniform_ = pixel_shader_->get_uniform_location("threshold");
	}

	if(set_aspect_ratio_ != aspect_ratio) {
		set_aspect_ratio_ = aspect_ratio;
		float buffer[4*4];

		// establish texture coordinates
		buffer[2] = 0.0f;
		buffer[3] = 0.0f;
		buffer[6] = 0.0f;
		buffer[7] = float(height_) / float(expanded_height_);
		buffer[10] = float(width_) / float(expanded_width_);
		buffer[11] = 0.0f;
		buffer[14] = buffer[10];
		buffer[15] = buffer[7];

		// determine positions; rule is to keep the same height and centre
		float internal_aspect_ratio = float(width_) / float(height_);
		float aspect_ratio_ratio = internal_aspect_ratio / aspect_ratio;

		buffer[0] = -aspect_ratio_ratio;	buffer[1] = -1.0f;
		buffer[4] = -aspect_ratio_ratio;	buffer[5] = 1.0f;
		buffer[8] = aspect_ratio_ratio;		buffer[9] = -1.0f;
		buffer[12] = aspect_ratio_ratio;	buffer[13] = 1.0f;

		// upload buffer
		test_gl(glBindBuffer, GL_ARRAY_BUFFER, drawing_array_buffer_);
		test_gl(glBufferData, GL_ARRAY_BUFFER, sizeof(buffer), buffer, GL_STATIC_DRAW);
	}

	pixel_shader_->bind();
	test_gl(glUniform1f, threshold_uniform_, colour_threshold);

	test_gl(glBindVertexArray, drawing_vertex_array_);
	test_gl(glDrawArrays, GL_TRIANGLE_STRIP, 0, 4);
}